

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  long lVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  char **ppcVar8;
  size_t __size;
  char *pcVar9;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar10;
  int format;
  int align;
  ulong uVar11;
  uchar *dstBuf;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (1 < argc) {
    uVar10 = 1;
    do {
      pcVar9 = argv[uVar10];
      iVar1 = strcasecmp(pcVar9,"-yuv");
      piVar5 = &doYUV;
      if (iVar1 != 0) {
        iVar1 = strcasecmp(pcVar9,"-noyuvpad");
        piVar5 = &pad;
        if (iVar1 != 0) {
          iVar1 = strcasecmp(pcVar9,"-alloc");
          piVar5 = &alloc;
          if (iVar1 != 0) {
            iVar1 = strcasecmp(pcVar9,"-bmp");
            if (iVar1 != 0) {
              printf("\nUSAGE: %s [options]\n\n",*argv);
              puts("Options:");
              puts("-yuv = test YUV encoding/decoding support");
              puts("-noyuvpad = do not pad each line of each Y, U, and V plane to the nearest");
              puts("            4-byte boundary");
              puts("-alloc = test automatic buffer allocation");
              puts("-bmp = tjLoadImage()/tjSaveImage() unit test\n");
              exit(1);
            }
            uVar10 = 1;
            do {
              ppcVar8 = pixFormatStr;
              lVar2 = 0;
              do {
                uVar4 = (uint)uVar10;
                printf("%s Top-Down BMP (row alignment = %d bytes)  ...  ",*ppcVar8,uVar10);
                align = (int)lVar2;
                iVar1 = doBmpTest("bmp",uVar4,align,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Top-Down PPM (row alignment = %d bytes)  ...  ",*ppcVar8,uVar10);
                iVar1 = doBmpTest("ppm",uVar4,align,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up BMP (row alignment = %d bytes)  ...  ",*ppcVar8,uVar10);
                iVar1 = doBmpTest("bmp",uVar4,align,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up PPM (row alignment = %d bytes)  ...  ",*ppcVar8,uVar10);
                iVar1 = doBmpTest("ppm",uVar4,align,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                lVar2 = lVar2 + 1;
                ppcVar8 = ppcVar8 + 1;
              } while (lVar2 != 0xc);
              uVar10 = (ulong)(uVar4 * 2);
              if (4 < uVar4) {
                return 0;
              }
            } while( true );
          }
        }
      }
      *piVar5 = 1;
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
  }
  if (alloc != 0) {
    puts("Testing automatic buffer allocation");
  }
  iVar1 = (doYUV == 0) + 4;
  uVar10 = tjBufSize(0x6883,0x6883,0);
  if (uVar10 < 0xffffffff) {
    pcVar9 = "tjBufSize() overflow";
  }
  else {
    uVar10 = TJBUFSIZE(0x6883,0x6883);
    if (uVar10 < 0xffffffff) {
      pcVar9 = "TJBUFSIZE() overflow";
    }
    else {
      uVar10 = tjBufSizeYUV2(0x93ce,1,0x93ce,0);
      if (uVar10 < 0xffffffff) {
        pcVar9 = "tjBufSizeYUV2() overflow";
      }
      else {
        uVar10 = TJBUFSIZEYUV(0x93ce,0x93ce,0);
        if (uVar10 < 0xffffffff) {
          pcVar9 = "TJBUFSIZEYUV() overflow";
        }
        else {
          uVar10 = tjBufSizeYUV(0x93ce,0x93ce,0);
          if (uVar10 < 0xffffffff) {
            pcVar9 = "tjBufSizeYUV() overflow";
          }
          else {
            uVar10 = tjPlaneSizeYUV(0,0x10000,0,0x10000);
            if (0xfffffffe < uVar10) goto LAB_001026ef;
            pcVar9 = "tjPlaneSizeYUV() overflow";
          }
        }
      }
    }
  }
  printf("ERROR: %s\n",pcVar9);
  exitStatus = -1;
LAB_001026ef:
  doTest(0x23,0x27,_3byteFormats,2,0,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,0,"test");
  doTest(0x29,0x23,_3byteFormats,2,1,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,1,"test");
  doTest(0x27,0x29,_3byteFormats,2,2,"test");
  doTest(0x29,0x23,_4byteFormats,iVar1,2,"test");
  doTest(0x23,0x27,_3byteFormats,2,4,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,4,"test");
  doTest(0x29,0x23,_3byteFormats,2,5,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,5,"test");
  doTest(0x27,0x29,_onlyGray,1,3,"test");
  doTest(0x29,0x23,_3byteFormats,2,3,"test");
  doTest(0x23,0x27,_4byteFormats,4,3,"test");
  dstBuf = (uchar *)0x0;
  local_58 = 0;
  lVar2 = tjInitCompress();
  if (lVar2 == 0) {
    pcVar9 = (char *)tjGetErrorStr();
    __ptr = (void *)0x0;
LAB_00102c67:
    __format = "TurboJPEG ERROR:\n%s\n";
LAB_00102c6a:
    printf(__format,pcVar9);
    exitStatus = -1;
  }
  else {
    puts("Buffer size regression test");
    local_68 = 0;
    local_60 = lVar2;
    do {
      uVar10 = 1;
      lVar6 = 4;
      do {
        local_40 = uVar10 * 4;
        local_50 = 0x30;
        if (uVar10 == 1) {
          local_50 = 0x800;
        }
        uVar11 = 1;
        local_48 = lVar6;
        do {
          lVar7 = lVar6 + (ulong)(lVar6 == 0);
          local_38 = lVar6;
          if (((uint)((int)uVar11 * -0x3d70a3d7) >> 2 | (int)uVar11 * 0x40000000) < 0x28f5c29) {
            printf("%.4d x %.4d\b\b\b\b\b\b\b\b\b\b\b",uVar10 & 0xffffffff,uVar11 & 0xffffffff);
          }
          __size = uVar11 * local_40;
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) {
LAB_00102c48:
            __format = "ERROR: %s\n";
            pcVar9 = "Memory allocation failure";
            __ptr = (void *)0x0;
            goto LAB_00102c6a;
          }
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_58 = tjBufSize(uVar10 & 0xffffffff,uVar11 & 0xffffffff,local_68);
            }
            else {
              local_58 = tjBufSizeYUV2(uVar10 & 0xffffffff,pad,uVar11 & 0xffffffff,local_68);
            }
            dstBuf = (uchar *)tjAlloc(local_58);
            if (dstBuf != (uchar *)0x0) goto LAB_001029b7;
LAB_00102dbb:
            __format = "ERROR: %s\n";
            pcVar9 = "Memory allocation failure";
            goto LAB_00102c6a;
          }
LAB_001029b7:
          lVar6 = 0;
          do {
            lVar3 = random();
            lVar2 = local_60;
            *(char *)((long)__ptr + lVar6) = -(0x3ffffffe < lVar3);
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
          if (doYUV == 0) {
            iVar1 = tjCompress2(local_60,__ptr,uVar10 & 0xffffffff,0,uVar11 & 0xffffffff,3,&dstBuf,
                                &local_58,local_68,100,(ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(local_60,__ptr,uVar10 & 0xffffffff,0,uVar11 & 0xffffffff,3,dstBuf,
                                 pad,local_68,0);
          }
          if (iVar1 == -1) {
LAB_00102c5b:
            pcVar9 = (char *)tjGetErrorStr();
            goto LAB_00102c67;
          }
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) goto LAB_00102c48;
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_58 = tjBufSize(uVar11 & 0xffffffff,uVar10 & 0xffffffff,local_68);
            }
            else {
              local_58 = tjBufSizeYUV2(uVar11 & 0xffffffff,pad,uVar10 & 0xffffffff,local_68);
            }
            dstBuf = (uchar *)tjAlloc(local_58 & 0xffffffff);
            if (dstBuf == (uchar *)0x0) goto LAB_00102dbb;
          }
          lVar6 = 0;
          do {
            lVar3 = random();
            lVar2 = local_60;
            *(char *)((long)__ptr + lVar6) = -(0x3ffffffe < lVar3);
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
          if (doYUV == 0) {
            iVar1 = tjCompress2(local_60,__ptr,uVar11 & 0xffffffff,0,uVar10 & 0xffffffff,3,&dstBuf,
                                &local_58,local_68,100,(ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(local_60,__ptr,uVar11 & 0xffffffff,0,uVar10 & 0xffffffff,3,dstBuf,
                                 pad,local_68,0);
          }
          if (iVar1 == -1) goto LAB_00102c5b;
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          uVar11 = uVar11 + 1;
          lVar6 = local_38 + local_48;
        } while (uVar11 != local_50);
        uVar10 = uVar10 + 1;
        lVar6 = local_48 + 4;
      } while (uVar10 != 0x30);
      uVar4 = (int)local_68 + 1;
      local_68 = (ulong)uVar4;
    } while (uVar4 != 6);
    puts("Done.      ");
    __ptr = (void *)0x0;
  }
  free(__ptr);
  tjFree(dstBuf);
  if (lVar2 != 0) {
    tjDestroy(lVar2);
  }
  if (doYUV != 0) {
    puts("\n--------------------\n");
    doTest(0x30,0x30,_onlyRGB,1,0,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,1,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,2,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,4,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,5,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,3,"test_yuv0");
    doTest(0x30,0x30,_onlyGray,1,3,"test_yuv0");
  }
  return exitStatus;
}

Assistant:

int main(int argc, char *argv[])
{
  int i, num4bf = 5;

#ifdef _WIN32
  srand((unsigned int)time(NULL));
#endif
  if (argc > 1) {
    for (i = 1; i < argc; i++) {
      if (!strcasecmp(argv[i], "-yuv")) doYUV = 1;
      else if (!strcasecmp(argv[i], "-noyuvpad")) pad = 1;
      else if (!strcasecmp(argv[i], "-alloc")) alloc = 1;
      else if (!strcasecmp(argv[i], "-bmp")) return bmpTest();
      else usage(argv[0]);
    }
  }
  if (alloc) printf("Testing automatic buffer allocation\n");
  if (doYUV) num4bf = 4;
  overflowTest();
  doTest(35, 39, _3byteFormats, 2, TJSAMP_444, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_444, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_422, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_422, "test");
  doTest(39, 41, _3byteFormats, 2, TJSAMP_420, "test");
  doTest(41, 35, _4byteFormats, num4bf, TJSAMP_420, "test");
  doTest(35, 39, _3byteFormats, 2, TJSAMP_440, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_440, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_411, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_411, "test");
  doTest(39, 41, _onlyGray, 1, TJSAMP_GRAY, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_GRAY, "test");
  doTest(35, 39, _4byteFormats, 4, TJSAMP_GRAY, "test");
  bufSizeTest();
  if (doYUV) {
    printf("\n--------------------\n\n");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_444, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_422, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_420, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_440, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_411, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_GRAY, "test_yuv0");
    doTest(48, 48, _onlyGray, 1, TJSAMP_GRAY, "test_yuv0");
  }

  return exitStatus;
}